

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseTypeIdent(Parser *this,Type *type)

{
  bool bVar1;
  EnumDef *pEVar2;
  StructDef *pSVar3;
  undefined8 in_RDX;
  EnumDef *enum_def;
  undefined1 local_40 [8];
  string id;
  Type *type_local;
  Parser *this_local;
  CheckedError *ce;
  
  id.field_2._8_8_ = in_RDX;
  std::__cxx11::string::string((string *)local_40,(string *)&type[1].struct_def);
  Expect(this,(int)type);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (!bVar1) {
    CheckedError::~CheckedError((CheckedError *)this);
    ParseNamespacing(this,(string *)type,(string *)local_40);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (!bVar1) {
      CheckedError::~CheckedError((CheckedError *)this);
      pEVar2 = LookupEnum((Parser *)type,(string *)local_40);
      if (pEVar2 == (EnumDef *)0x0) {
        *(undefined4 *)id.field_2._8_8_ = 0xf;
        pSVar3 = LookupCreateStruct((Parser *)type,(string *)local_40,true,false);
        *(StructDef **)(id.field_2._8_8_ + 8) = pSVar3;
      }
      else {
        *(undefined8 *)id.field_2._8_8_ = *(undefined8 *)&pEVar2->underlying_type;
        *(StructDef **)(id.field_2._8_8_ + 8) = (pEVar2->underlying_type).struct_def;
        *(EnumDef **)(id.field_2._8_8_ + 0x10) = (pEVar2->underlying_type).enum_def;
        *(uint16_t *)(id.field_2._8_8_ + 0x18) = (pEVar2->underlying_type).fixed_length;
        if ((pEVar2->is_union & 1U) != 0) {
          *(undefined4 *)id.field_2._8_8_ = 0x10;
        }
      }
      anon_unknown_0::NoError();
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTypeIdent(Type &type) {
  std::string id = attribute_;
  EXPECT(kTokenIdentifier);
  ECHECK(ParseNamespacing(&id, nullptr));
  auto enum_def = LookupEnum(id);
  if (enum_def) {
    type = enum_def->underlying_type;
    if (enum_def->is_union) type.base_type = BASE_TYPE_UNION;
  } else {
    type.base_type = BASE_TYPE_STRUCT;
    type.struct_def = LookupCreateStruct(id);
  }
  return NoError();
}